

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall punky::par::Parser::Parser(Parser *this,Lexer *lex)

{
  anon_class_8_1_8991fb9c local_2f8;
  InfixParseFn local_2f0;
  anon_class_8_1_8991fb9c local_2d0;
  InfixParseFn local_2c8;
  anon_class_8_1_8991fb9c local_2a8;
  InfixParseFn local_2a0;
  anon_class_8_1_8991fb9c local_280;
  InfixParseFn local_278;
  anon_class_8_1_8991fb9c local_258;
  InfixParseFn local_250;
  anon_class_8_1_8991fb9c local_230;
  InfixParseFn local_228;
  anon_class_8_1_8991fb9c local_208;
  InfixParseFn local_200;
  anon_class_8_1_8991fb9c local_1e0;
  InfixParseFn local_1d8;
  anon_class_8_1_8991fb9c local_1b8;
  InfixParseFn local_1b0;
  anon_class_8_1_8991fb9c local_190;
  PrefixParseFn local_188;
  anon_class_8_1_8991fb9c local_168;
  PrefixParseFn local_160;
  anon_class_8_1_8991fb9c local_140;
  PrefixParseFn local_138;
  anon_class_8_1_8991fb9c local_118;
  PrefixParseFn local_110;
  anon_class_8_1_8991fb9c local_f0;
  PrefixParseFn local_e8;
  anon_class_8_1_8991fb9c local_c8;
  PrefixParseFn local_c0;
  anon_class_8_1_8991fb9c local_a0;
  PrefixParseFn local_98;
  anon_class_8_1_8991fb9c local_78;
  PrefixParseFn local_70;
  anon_class_8_1_8991fb9c local_50;
  PrefixParseFn local_48;
  Lexer *local_18;
  Lexer *lex_local;
  Parser *this_local;
  
  local_18 = lex;
  lex_local = &this->m_lex;
  punky::lex::Lexer::Lexer(&this->m_lex,lex);
  punky::tok::Token::Token(&this->m_curr_tok);
  punky::tok::Token::Token(&this->m_peek_tok);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_errors);
  std::
  unordered_map<punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>,_std::hash<punky::tok::TokenType>,_std::equal_to<punky::tok::TokenType>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>_>_>_>
  ::unordered_map(&this->m_prefix_parse_fns);
  std::
  unordered_map<punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>,_std::hash<punky::tok::TokenType>,_std::equal_to<punky::tok::TokenType>,_std::allocator<std::pair<const_punky::tok::TokenType,_std::function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>_>_>_>
  ::unordered_map(&this->m_infix_parse_fns);
  consume(this);
  consume(this);
  local_50.this = this;
  std::function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>()>::
  function<punky::par::Parser::Parser(punky::lex::Lexer)::__0,void>
            ((function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>()>
              *)&local_48,&local_50);
  register_prefix(this,Identifier,&local_48);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  ~function(&local_48);
  local_78.this = this;
  std::function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>()>::
  function<punky::par::Parser::Parser(punky::lex::Lexer)::__1,void>
            ((function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>()>
              *)&local_70,&local_78);
  register_prefix(this,Int,&local_70);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  ~function(&local_70);
  local_a0.this = this;
  std::function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>()>::
  function<punky::par::Parser::Parser(punky::lex::Lexer)::__2,void>
            ((function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>()>
              *)&local_98,&local_a0);
  register_prefix(this,Bang,&local_98);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  ~function(&local_98);
  local_c8.this = this;
  std::function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>()>::
  function<punky::par::Parser::Parser(punky::lex::Lexer)::__3,void>
            ((function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>()>
              *)&local_c0,&local_c8);
  register_prefix(this,Minus,&local_c0);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  ~function(&local_c0);
  local_f0.this = this;
  std::function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>()>::
  function<punky::par::Parser::Parser(punky::lex::Lexer)::__4,void>
            ((function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>()>
              *)&local_e8,&local_f0);
  register_prefix(this,True,&local_e8);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  ~function(&local_e8);
  local_118.this = this;
  std::function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>()>::
  function<punky::par::Parser::Parser(punky::lex::Lexer)::__5,void>
            ((function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>()>
              *)&local_110,&local_118);
  register_prefix(this,False,&local_110);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  ~function(&local_110);
  local_140.this = this;
  std::function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>()>::
  function<punky::par::Parser::Parser(punky::lex::Lexer)::__6,void>
            ((function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>()>
              *)&local_138,&local_140);
  register_prefix(this,LeftParen,&local_138);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  ~function(&local_138);
  local_168.this = this;
  std::function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>()>::
  function<punky::par::Parser::Parser(punky::lex::Lexer)::__7,void>
            ((function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>()>
              *)&local_160,&local_168);
  register_prefix(this,If,&local_160);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  ~function(&local_160);
  local_190.this = this;
  std::function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>()>::
  function<punky::par::Parser::Parser(punky::lex::Lexer)::__8,void>
            ((function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>()>
              *)&local_188,&local_190);
  register_prefix(this,Func,&local_188);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_()>::
  ~function(&local_188);
  local_1b8.this = this;
  std::
  function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>(std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>)>
  ::function<punky::par::Parser::Parser(punky::lex::Lexer)::__9,void>
            ((function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>(std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>)>
              *)&local_1b0,&local_1b8);
  register_infix(this,Plus,&local_1b0);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::~function(&local_1b0);
  local_1e0.this = this;
  std::
  function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>(std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>)>
  ::function<punky::par::Parser::Parser(punky::lex::Lexer)::__10,void>
            ((function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>(std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>)>
              *)&local_1d8,&local_1e0);
  register_infix(this,Minus,&local_1d8);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::~function(&local_1d8);
  local_208.this = this;
  std::
  function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>(std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>)>
  ::function<punky::par::Parser::Parser(punky::lex::Lexer)::__11,void>
            ((function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>(std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>)>
              *)&local_200,&local_208);
  register_infix(this,Asterisk,&local_200);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::~function(&local_200);
  local_230.this = this;
  std::
  function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>(std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>)>
  ::function<punky::par::Parser::Parser(punky::lex::Lexer)::__12,void>
            ((function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>(std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>)>
              *)&local_228,&local_230);
  register_infix(this,Slash,&local_228);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::~function(&local_228);
  local_258.this = this;
  std::
  function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>(std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>)>
  ::function<punky::par::Parser::Parser(punky::lex::Lexer)::__13,void>
            ((function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>(std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>)>
              *)&local_250,&local_258);
  register_infix(this,EqualEqual,&local_250);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::~function(&local_250);
  local_280.this = this;
  std::
  function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>(std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>)>
  ::function<punky::par::Parser::Parser(punky::lex::Lexer)::__14,void>
            ((function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>(std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>)>
              *)&local_278,&local_280);
  register_infix(this,BangEqual,&local_278);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::~function(&local_278);
  local_2a8.this = this;
  std::
  function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>(std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>)>
  ::function<punky::par::Parser::Parser(punky::lex::Lexer)::__15,void>
            ((function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>(std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>)>
              *)&local_2a0,&local_2a8);
  register_infix(this,Less,&local_2a0);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::~function(&local_2a0);
  local_2d0.this = this;
  std::
  function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>(std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>)>
  ::function<punky::par::Parser::Parser(punky::lex::Lexer)::__16,void>
            ((function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>(std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>)>
              *)&local_2c8,&local_2d0);
  register_infix(this,Greater,&local_2c8);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::~function(&local_2c8);
  local_2f8.this = this;
  std::
  function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>(std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>)>
  ::function<punky::par::Parser::Parser(punky::lex::Lexer)::__17,void>
            ((function<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>(std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>)>
              *)&local_2f0,&local_2f8);
  register_infix(this,LeftParen,&local_2f0);
  std::
  function<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>)>
  ::~function(&local_2f0);
  return;
}

Assistant:

Parser::Parser(Lexer lex) :
  m_lex{std::move(lex)}
{
    consume();
    consume();

    register_prefix(TokenType::Identifier, [this] { return parse_identifier(); });
    register_prefix(TokenType::Int, [this] { return parse_int_literal(); });
    register_prefix(TokenType::Bang, [this] { return parse_prefix_expression(); });
    register_prefix(TokenType::Minus, [this] { return parse_prefix_expression(); });
    register_prefix(TokenType::True, [this] { return parse_boolean(); });
    register_prefix(TokenType::False, [this] { return parse_boolean(); });
    register_prefix(TokenType::LeftParen, [this] { return parse_grouped_expression(); });
    register_prefix(TokenType::If, [this] { return parse_if_expression(); });
    register_prefix(TokenType::Func, [this] { return parse_function_literal(); });

    register_infix(TokenType::Plus, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Minus, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Asterisk, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Slash, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::EqualEqual, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::BangEqual, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Less, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Greater, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::LeftParen, [this](ast::ExprNodePtr function) {
        return parse_call_expression(std::move(function));
    });
}